

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::invalidate_read(RegAllocator *this,int pos)

{
  ostream *poVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> __it;
  undefined4 in_register_00000034;
  Tag *pTVar2;
  Function *pFVar3;
  char *tag;
  const_iterator __position;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this_00;
  ostream local_11f;
  allocator<char> local_11e;
  allocator<char> local_11d;
  uint local_11c;
  string local_118;
  undefined1 local_f8 [40];
  undefined **local_d0;
  size_type local_c8;
  undefined1 local_c0 [56];
  Function local_88;
  
  pTVar2 = (Tag *)CONCAT44(in_register_00000034,pos);
  local_11f = (ostream)0x1;
  local_11c = pos;
  AixLog::operator<<(&local_11f,(Severity *)pTVar2);
  AixLog::Tag::Tag((Tag *)(local_c0 + 8));
  AixLog::operator<<((ostream *)(local_c0 + 8),pTVar2);
  local_c8 = std::chrono::_V2::system_clock::now();
  local_d0 = &PTR__Timestamp_001d8f28;
  local_c0[0] = '\0';
  AixLog::operator<<((ostream *)&local_d0,(Timestamp *)pTVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"invalidate_read",&local_11d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_11e);
  pFVar3 = (Function *)local_f8;
  AixLog::Function::Function(&local_88,(string *)pFVar3,&local_118,0xe7);
  AixLog::operator<<((ostream *)&local_88,pFVar3);
  tag = "Invalidating: ";
  std::operator<<((ostream *)&std::clog,"Invalidating: ");
  AixLog::Function::~Function(&local_88);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)local_f8);
  pTVar2 = (Tag *)(local_c0 + 8);
  AixLog::Tag::~Tag(pTVar2);
  local_f8._32_8_ = &this->active;
  __it._M_cur = (__node_type *)(this->active)._M_h._M_before_begin._M_nxt;
  this_00 = &this->active_reg_map;
  do {
    while( true ) {
      if (__it._M_cur == (__node_type *)0x0) {
        local_11f = (ostream)0x1;
        AixLog::operator<<(&local_11f,(Severity *)tag);
        AixLog::Tag::Tag((Tag *)(local_c0 + 8));
        AixLog::operator<<((ostream *)(local_c0 + 8),(Tag *)tag);
        local_c8 = std::chrono::_V2::system_clock::now();
        local_d0 = &PTR__Timestamp_001d8f28;
        local_c0[0] = '\0';
        AixLog::operator<<((ostream *)&local_d0,(Timestamp *)tag);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f8,"invalidate_read",&local_11d);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                   ,&local_11e);
        pFVar3 = (Function *)local_f8;
        AixLog::Function::Function(&local_88,(string *)pFVar3,&local_118,0xfc);
        AixLog::operator<<((ostream *)&local_88,pFVar3);
        std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
        AixLog::Function::~Function(&local_88);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)local_f8);
        AixLog::Tag::~Tag((Tag *)(local_c0 + 8));
        return;
      }
      __position._M_node = (_List_node_base *)this_00;
      if (*(uint *)((long)&((__it._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_unsigned_int,_backend::codegen::Interval>_>
                           ._M_storage._M_storage + 8) <= local_11c) break;
      __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    }
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)this_00) goto LAB_001637fa;
    } while (*(anon_struct_4_0_00000001_for___align *)((long)&__position._M_node[1]._M_next + 4) !=
             ((__it._M_cur)->
             super__Hash_node_value<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
             ).
             super__Hash_node_value_base<std::pair<const_unsigned_int,_backend::codegen::Interval>_>
             ._M_storage._M_storage.__align);
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::erase(this_00,__position);
LAB_001637fa:
    local_11f = (ostream)0x1;
    AixLog::operator<<(&local_11f,(Severity *)__position._M_node);
    AixLog::Tag::Tag(pTVar2);
    AixLog::operator<<((ostream *)pTVar2,(Tag *)__position._M_node);
    local_c8 = std::chrono::_V2::system_clock::now();
    local_d0 = &PTR__Timestamp_001d8f28;
    local_c0[0] = '\0';
    AixLog::operator<<((ostream *)&local_d0,(Timestamp *)__position._M_node);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"invalidate_read",&local_11d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_11e);
    pFVar3 = (Function *)local_f8;
    AixLog::Function::Function(&local_88,(string *)local_f8,&local_118,0xf6);
    AixLog::operator<<((ostream *)&local_88,pFVar3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::operator<<(poVar1," ");
    AixLog::Function::~Function(&local_88);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_f8);
    AixLog::Tag::~Tag(pTVar2);
    tag = (char *)__it._M_cur;
    __it._M_cur = (__node_type *)
                  std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_f8._32_8_,__it._M_cur);
  } while( true );
}

Assistant:

void invalidate_read(int pos) {
    LOG(DEBUG) << "Invalidating: ";
    auto it = active.begin();
    while (it != active.end()) {
      if (it->second.end <= pos) {
        // The register is no longer to be read from, thus is freed
        auto ait = active_reg_map.begin();
        while (ait != active_reg_map.end()) {
          auto r = *ait;
          if (r.second == it->first) {
            active_reg_map.erase(ait);
            break;
          } else {
            ait++;
          }
        }
        LOG(DEBUG) << it->first << " ";
        it = active.erase(it);
      } else {
        it++;
      }
    }
    LOG(DEBUG) << std::endl;
  }